

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.hpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
get_histogram<unsigned_int,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                end,size_t size)

{
  pointer puVar1;
  pointer puVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  allocator_type local_19;
  
  if (size == 0) {
    _Var3 = std::
            __max_element<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_less_iter>
                      (begin._M_current,end._M_current);
    size = (long)*_Var3._M_current + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,size,&local_19);
  puVar2 = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  for (; begin._M_current != end._M_current; begin._M_current = begin._M_current + 1) {
    puVar1 = puVar2 + (byte)*begin._M_current;
    *puVar1 = *puVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> get_histogram(Iterator begin, Iterator end, std::size_t size = 0) {
    if (size == 0)
        size = static_cast<std::size_t>(*std::max_element(begin, end)) + 1;
    std::vector<T> hist(size);

    while (begin != end) {
        char c = *begin;
        std::size_t s = (unsigned char)c;
        ++hist[s];
        ++begin;
    }

    return hist;
}